

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O1

void iq3xs_init_impl(int grid_size)

{
  uint32_t uVar1;
  byte bVar2;
  byte bVar6;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  char cVar14;
  char cVar15;
  ulong uVar16;
  char cVar17;
  char cVar18;
  undefined1 auVar19 [14];
  undefined1 auVar20 [15];
  undefined1 auVar21 [14];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [13];
  undefined8 uVar33;
  undefined1 auVar34 [15];
  uint5 uVar35;
  undefined1 auVar36 [15];
  unkuint9 Var37;
  undefined1 auVar38 [11];
  undefined1 auVar39 [13];
  undefined1 auVar40 [14];
  undefined6 uVar41;
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [15];
  undefined1 auVar45 [11];
  undefined1 auVar46 [13];
  undefined1 auVar47 [14];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [13];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  unkbyte10 Var53;
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  uint6 uVar56;
  size_t __nmemb;
  uint32_t *puVar57;
  ulong uVar58;
  int *__s;
  int *__base;
  ulong uVar59;
  ulong uVar60;
  int iVar61;
  int iVar62;
  int i;
  uint uVar63;
  int iVar64;
  uint16_t *puVar65;
  bool bVar66;
  ushort uVar67;
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  ushort uVar68;
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 uVar81;
  uint uVar83;
  uint uVar85;
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  short sVar84;
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  uint uVar87;
  uint uVar88;
  undefined1 auVar86 [16];
  ushort uVar89;
  undefined4 uVar91;
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined2 uVar82;
  
  uVar16 = (ulong)(uint)grid_size;
  if ((grid_size != 0x100) && (grid_size != 0x200)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-quants.c"
               ,0xd14,"GGML_ASSERT(%s) failed","grid_size == 256 || grid_size == 512");
  }
  bVar66 = grid_size != 0x100;
  if (iq3_data[bVar66].grid != (uint32_t *)0x0) {
    return;
  }
  puVar65 = iq3xs_init_impl::kgrid_512;
  if (grid_size == 0x100) {
    puVar65 = iq3xs_init_impl::kgrid_256;
  }
  __nmemb = (size_t)grid_size;
  puVar57 = (uint32_t *)malloc(__nmemb * 4);
  if (0 < grid_size) {
    uVar58 = 0;
    do {
      uVar68 = puVar65[uVar58];
      uVar12 = uVar68 >> 9;
      uVar89 = uVar68 & 0xff;
      uVar10 = uVar68 >> 3 & 0xff;
      uVar11 = uVar68 >> 6 & 0xff;
      bVar2 = (uVar89 != 0) * (uVar89 < 0x100) * (char)uVar68 - (0xff < uVar89);
      bVar3 = (uVar10 != 0) * (uVar10 < 0x100) * (char)(uVar68 >> 3) - (0xff < uVar10);
      bVar4 = (uVar11 != 0) * (uVar11 < 0x100) * (char)(uVar68 >> 6) - (0xff < uVar11);
      bVar5 = (uVar12 != 0) * (uVar12 < 0x100) * (byte)(uVar68 >> 9) - (0xff < uVar12);
      puVar57[uVar58] =
           CONCAT13(((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5)) * '\x02',
                    CONCAT12(((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4)) * '\x02',
                             CONCAT11(((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3)) *
                                      '\x02',((bVar2 != 0) * (bVar2 < 0x100) * bVar2 -
                                             (0xff < bVar2)) * '\x02'))) & 0xe0e0e0e | 0x1010101;
      uVar58 = uVar58 + 1;
    } while (uVar16 != uVar58);
  }
  iq3_data[bVar66].grid = puVar57;
  __s = (int *)malloc(0x4000);
  iq3_data[bVar66].map = __s;
  memset(__s,0xff,0x4000);
  if (0 < grid_size) {
    uVar58 = 0;
    do {
      uVar63 = puVar57[uVar58];
      auVar32[0xc] = (char)(uVar63 >> 0x18);
      auVar32._0_12_ = ZEXT712(0);
      uVar35 = CONCAT32(auVar32._10_3_,(ushort)(byte)(uVar63 >> 0x10));
      auVar50._5_8_ = 0;
      auVar50._0_5_ = uVar35;
      auVar90._0_4_ = (uVar63 & 0xff) - 1;
      auVar90._4_4_ = (int)CONCAT72(SUB137(auVar50 << 0x40,6),(ushort)(byte)(uVar63 >> 8)) + -1;
      auVar90._8_4_ = (int)uVar35 + -1;
      auVar90._12_4_ = (uint3)(auVar32._10_3_ >> 0x10) - 1;
      auVar92 = packssdw(auVar90,auVar90);
      uVar68 = -(short)(auVar90._0_4_ >> 0x1f);
      cVar14 = -(char)(auVar90._0_4_ >> 0x1f);
      uVar10 = -(short)(auVar90._4_4_ >> 0x1f);
      cVar15 = -(char)(auVar90._4_4_ >> 0x1f);
      uVar11 = -(short)(auVar90._8_4_ >> 0x1f);
      cVar17 = (char)(auVar90._8_4_ >> 0x1f);
      sVar84 = (short)(auVar90._12_4_ >> 0x1f);
      uVar12 = -sVar84;
      cVar18 = (char)(auVar90._12_4_ >> 0x1f);
      uVar89 = -sVar84;
      auVar86._0_2_ =
           (ushort)(byte)((uVar68 != 0) * (uVar68 < 0x100) * cVar14 - (0xff < uVar68)) +
           auVar92._0_2_;
      auVar86._2_2_ =
           (ushort)(byte)((uVar10 != 0) * (uVar10 < 0x100) * cVar15 - (0xff < uVar10)) +
           auVar92._2_2_;
      auVar86._4_2_ =
           (ushort)(byte)((uVar11 != 0) * (uVar11 < 0x100) * -cVar17 - (0xff < uVar11)) +
           auVar92._4_2_;
      auVar86._6_2_ =
           (ushort)(byte)((uVar12 != 0) * (uVar12 < 0x100) * -cVar18 - (0xff < uVar12)) +
           auVar92._6_2_;
      auVar86._8_2_ =
           (ushort)(byte)((uVar68 != 0) * (uVar68 < 0x100) * cVar14 - (0xff < uVar68)) +
           auVar92._8_2_;
      auVar86._10_2_ =
           (ushort)(byte)((uVar10 != 0) * (uVar10 < 0x100) * cVar15 - (0xff < uVar10)) +
           auVar92._10_2_;
      auVar86._12_2_ =
           (ushort)(byte)((uVar11 != 0) * (uVar11 < 0x100) * -cVar17 - (0xff < uVar11)) +
           auVar92._12_2_;
      auVar86._14_2_ =
           (ushort)(byte)((uVar89 != 0) * (uVar89 < 0x100) * -cVar18 - (0xff < uVar89)) +
           auVar92._14_2_;
      auVar90 = psraw(auVar86,1);
      auVar92._0_8_ =
           CONCAT26(auVar90._6_2_ * 0x200,
                    CONCAT24(auVar90._4_2_ * 0x40,CONCAT22(auVar90._2_2_ * 8,auVar90._0_2_)));
      auVar92._8_8_ = 0;
      uVar91 = (undefined4)(auVar92._0_8_ >> 0x20);
      auVar93._4_4_ = uVar91;
      auVar93._0_4_ = uVar91;
      auVar93._8_4_ = uVar91;
      auVar93._12_4_ = uVar91;
      __s[(ushort)(SUB162(auVar93 | auVar92,2) | SUB162(auVar93 | auVar92,0))] = (int)uVar58;
      uVar58 = uVar58 + 1;
    } while (uVar16 != uVar58);
  }
  uVar63 = grid_size == 0x100 ^ 3;
  __base = (int *)malloc((long)(grid_size * 2) << 2);
  uVar58 = 0;
  iVar61 = 0;
  iVar64 = 0;
  do {
    if (__s[uVar58] < 0) {
      if (0 < grid_size) {
        uVar83 = (uint)uVar58;
        uVar85 = uVar83 >> 9;
        uVar87 = uVar83 >> 6;
        uVar83 = uVar83 >> 3;
        uVar68 = (ushort)uVar58 & 0xff;
        uVar10 = (ushort)uVar83 & 0xff;
        uVar11 = (ushort)uVar87 & 0xff;
        uVar12 = (ushort)uVar85 & 0xff;
        bVar6 = ((uVar58 & 0xff) != 0) * (uVar68 < 0x100) * (char)uVar58 - (0xff < uVar68);
        uVar67 = (ushort)bVar6;
        bVar7 = ((uVar83 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar83 - (0xff < uVar10);
        bVar8 = ((uVar87 & 0xff) != 0) * (uVar11 < 0x100) * (char)uVar87 - (0xff < uVar11);
        bVar9 = ((uVar85 & 0xff) != 0) * (uVar12 < 0x100) * (char)uVar85 - (0xff < uVar12);
        bVar2 = ((uVar58 & 0xff) != 0) * (uVar68 < 0x100) * (char)uVar58 - (0xff < uVar68);
        bVar5 = ((uVar83 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar83 - (0xff < uVar10);
        bVar3 = ((uVar87 & 0xff) != 0) * (uVar11 < 0x100) * (char)uVar87 - (0xff < uVar11);
        bVar4 = ((uVar85 & 0xff) != 0) * (uVar12 < 0x100) * (char)uVar85 - (0xff < uVar12);
        uVar68 = (ushort)bVar7;
        uVar10 = (ushort)bVar8;
        uVar11 = (ushort)bVar9;
        uVar12 = (ushort)bVar2;
        uVar89 = (ushort)bVar5;
        uVar13 = (ushort)bVar3;
        auVar69[1] = ((bVar7 != 0) * (uVar68 < 0x100) * bVar7 - (0xff < uVar68)) * '\x02';
        auVar69[0] = ((bVar6 != 0) * (uVar67 < 0x100) * bVar6 - (0xff < uVar67)) * '\x02';
        auVar69[2] = ((bVar8 != 0) * (uVar10 < 0x100) * bVar8 - (0xff < uVar10)) * '\x02';
        auVar69[3] = ((bVar9 != 0) * (uVar11 < 0x100) * bVar9 - (0xff < uVar11)) * '\x02';
        auVar69[4] = ((bVar2 != 0) * (uVar12 < 0x100) * bVar2 - (0xff < uVar12)) * '\x02';
        auVar69[5] = ((bVar5 != 0) * (uVar89 < 0x100) * bVar5 - (0xff < uVar89)) * '\x02';
        auVar69[6] = ((bVar3 != 0) * (uVar13 < 0x100) * bVar3 - (0xff < uVar13)) * '\x02';
        auVar69[7] = ((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4)) * '\x02';
        auVar69[8] = ((bVar6 != 0) * (uVar67 < 0x100) * bVar6 - (0xff < uVar67)) * '\x02';
        auVar69[9] = ((bVar7 != 0) * (uVar68 < 0x100) * bVar7 - (0xff < uVar68)) * '\x02';
        auVar69[10] = ((bVar8 != 0) * (uVar10 < 0x100) * bVar8 - (0xff < uVar10)) * '\x02';
        auVar69[0xb] = ((bVar9 != 0) * (uVar11 < 0x100) * bVar9 - (0xff < uVar11)) * '\x02';
        auVar69[0xc] = ((bVar2 != 0) * (uVar12 < 0x100) * bVar2 - (0xff < uVar12)) * '\x02';
        auVar69[0xd] = ((bVar5 != 0) * (uVar89 < 0x100) * bVar5 - (0xff < uVar89)) * '\x02';
        auVar69[0xe] = ((bVar3 != 0) * (uVar13 < 0x100) * bVar3 - (0xff < uVar13)) * '\x02';
        auVar70 = auVar69 & DAT_0014e990._0_15_ | DAT_0014e6b0._0_15_;
        auVar72[0xd] = 0;
        auVar72._0_13_ = auVar70._0_13_;
        auVar72[0xe] = auVar70[7];
        auVar22[0xc] = auVar70[6];
        auVar22._0_12_ = auVar70._0_12_;
        auVar22._13_2_ = auVar72._13_2_;
        auVar24[0xb] = 0;
        auVar24._0_11_ = auVar70._0_11_;
        auVar24._12_3_ = auVar22._12_3_;
        auVar26[10] = auVar70[5];
        auVar26._0_10_ = auVar70._0_10_;
        auVar26._11_4_ = auVar24._11_4_;
        auVar28[9] = 0;
        auVar28._0_9_ = auVar70._0_9_;
        auVar28._10_5_ = auVar26._10_5_;
        auVar30[8] = auVar70[4];
        auVar30._0_8_ = auVar70._0_8_;
        auVar30._9_6_ = auVar28._9_6_;
        auVar36._7_8_ = 0;
        auVar36._0_7_ = auVar30._8_7_;
        Var37 = CONCAT81(SUB158(auVar36 << 0x40,7),auVar70[3]);
        auVar51._9_6_ = 0;
        auVar51._0_9_ = Var37;
        auVar38._1_10_ = SUB1510(auVar51 << 0x30,5);
        auVar38[0] = auVar70[2];
        auVar52._11_4_ = 0;
        auVar52._0_11_ = auVar38;
        auVar39._1_12_ = SUB1512(auVar52 << 0x20,3);
        auVar39[0] = auVar70[1];
        uVar68 = CONCAT11(0,auVar70[0]);
        auVar70._2_13_ = auVar39;
        auVar70._0_2_ = uVar68;
        auVar19._10_2_ = 0;
        auVar19._0_10_ = auVar70._0_10_;
        auVar19._12_2_ = (short)Var37;
        uVar56 = CONCAT42(auVar19._10_4_,auVar38._0_2_);
        auVar40._6_8_ = 0;
        auVar40._0_6_ = uVar56;
        uVar59 = 0;
        do {
          uVar1 = puVar57[uVar59];
          uVar81 = (undefined1)(uVar1 >> 0x18);
          uVar82 = CONCAT11(uVar81,uVar81);
          uVar81 = (undefined1)(uVar1 >> 0x10);
          uVar33 = CONCAT35(CONCAT21(uVar82,uVar81),CONCAT14(uVar81,uVar1));
          uVar81 = (undefined1)(uVar1 >> 8);
          uVar41 = CONCAT51(CONCAT41((int)((ulong)uVar33 >> 0x20),uVar81),uVar81);
          sVar84 = CONCAT11((char)uVar1,(char)uVar1);
          uVar60 = CONCAT62(uVar41,sVar84);
          auVar75._8_4_ = 0;
          auVar75._0_8_ = uVar60;
          auVar75._12_2_ = uVar82;
          auVar75._14_2_ = uVar82;
          uVar82 = (undefined2)((ulong)uVar33 >> 0x20);
          auVar74._12_4_ = auVar75._12_4_;
          auVar74._8_2_ = 0;
          auVar74._0_8_ = uVar60;
          auVar74._10_2_ = uVar82;
          auVar73._10_6_ = auVar74._10_6_;
          auVar73._8_2_ = uVar82;
          auVar73._0_8_ = uVar60;
          uVar82 = (undefined2)uVar41;
          auVar42._4_8_ = auVar73._8_8_;
          auVar42._2_2_ = uVar82;
          auVar42._0_2_ = uVar82;
          auVar76._0_4_ = ((int)sVar84 >> 8) - (uint)uVar68;
          auVar76._4_4_ =
               (auVar42._0_4_ >> 0x18) - (int)CONCAT82(SUB148(auVar40 << 0x40,6),auVar39._0_2_);
          auVar76._8_4_ = (auVar73._8_4_ >> 0x18) - (int)uVar56;
          auVar76._12_4_ = (auVar74._12_4_ >> 0x18) - (auVar19._10_4_ >> 0x10);
          auVar90 = packssdw(auVar76,auVar76);
          auVar86 = pmulhw(auVar90,auVar90);
          sVar84 = auVar90._6_2_ * auVar90._6_2_;
          iVar62 = CONCAT22(auVar86._6_2_,sVar84);
          Var53 = CONCAT64(CONCAT42(iVar62,auVar86._4_2_),
                           CONCAT22(auVar90._4_2_ * auVar90._4_2_,sVar84));
          auVar43._4_8_ = (long)((unkuint10)Var53 >> 0x10);
          auVar43._2_2_ = auVar86._2_2_;
          auVar43._0_2_ = auVar90._2_2_ * auVar90._2_2_;
          __base[uVar59 * 2] =
               auVar43._0_4_ + iVar62 +
               CONCAT22(auVar86._0_2_,auVar90._0_2_ * auVar90._0_2_) +
               (int)((unkuint10)Var53 >> 0x10);
          __base[uVar59 * 2 + 1] = (int)uVar59;
          uVar59 = uVar59 + 1;
        } while (uVar16 != uVar59);
      }
      qsort(__base,__nmemb,8,iq3_compare_func);
      if (grid_size < 1) {
        uVar59 = 0;
      }
      else {
        iVar62 = *__base;
        uVar83 = 1;
        uVar60 = 0;
        do {
          if (iVar62 < __base[uVar60 * 2]) {
            uVar59 = uVar60;
            if (uVar83 == uVar63) break;
            uVar83 = uVar83 + 1;
            iVar62 = __base[uVar60 * 2];
          }
          uVar60 = uVar60 + 1;
          uVar59 = uVar16;
        } while (uVar16 != uVar60);
      }
      iVar61 = iVar61 + 1;
      iVar64 = iVar64 + (int)uVar59;
    }
    uVar58 = uVar58 + 1;
  } while (uVar58 != 0x1000);
  puVar65 = (uint16_t *)malloc((long)(iVar61 + iVar64) * 2);
  iq3_data[bVar66].neighbours = puVar65;
  uVar58 = 0;
  uVar83 = 0;
  do {
    if (__s[uVar58] < 0) {
      if (0 < grid_size) {
        uVar85 = (uint)uVar58;
        uVar87 = uVar85 >> 9;
        uVar88 = uVar85 >> 6;
        uVar85 = uVar85 >> 3;
        uVar68 = (ushort)uVar58 & 0xff;
        uVar10 = (ushort)uVar85 & 0xff;
        uVar11 = (ushort)uVar88 & 0xff;
        uVar12 = (ushort)uVar87 & 0xff;
        bVar3 = ((uVar58 & 0xff) != 0) * (uVar68 < 0x100) * (char)uVar58 - (0xff < uVar68);
        uVar67 = (ushort)bVar3;
        bVar4 = ((uVar85 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar85 - (0xff < uVar10);
        bVar5 = ((uVar88 & 0xff) != 0) * (uVar11 < 0x100) * (char)uVar88 - (0xff < uVar11);
        bVar2 = ((uVar87 & 0xff) != 0) * (uVar12 < 0x100) * (char)uVar87 - (0xff < uVar12);
        bVar9 = ((uVar58 & 0xff) != 0) * (uVar68 < 0x100) * (char)uVar58 - (0xff < uVar68);
        bVar8 = ((uVar85 & 0xff) != 0) * (uVar10 < 0x100) * (char)uVar85 - (0xff < uVar10);
        bVar7 = ((uVar88 & 0xff) != 0) * (uVar11 < 0x100) * (char)uVar88 - (0xff < uVar11);
        bVar6 = ((uVar87 & 0xff) != 0) * (uVar12 < 0x100) * (char)uVar87 - (0xff < uVar12);
        uVar68 = (ushort)bVar4;
        uVar10 = (ushort)bVar5;
        uVar11 = (ushort)bVar2;
        uVar12 = (ushort)bVar9;
        uVar89 = (ushort)bVar8;
        uVar13 = (ushort)bVar7;
        auVar71[1] = ((bVar4 != 0) * (uVar68 < 0x100) * bVar4 - (0xff < uVar68)) * '\x02';
        auVar71[0] = ((bVar3 != 0) * (uVar67 < 0x100) * bVar3 - (0xff < uVar67)) * '\x02';
        auVar71[2] = ((bVar5 != 0) * (uVar10 < 0x100) * bVar5 - (0xff < uVar10)) * '\x02';
        auVar71[3] = ((bVar2 != 0) * (uVar11 < 0x100) * bVar2 - (0xff < uVar11)) * '\x02';
        auVar71[4] = ((bVar9 != 0) * (uVar12 < 0x100) * bVar9 - (0xff < uVar12)) * '\x02';
        auVar71[5] = ((bVar8 != 0) * (uVar89 < 0x100) * bVar8 - (0xff < uVar89)) * '\x02';
        auVar71[6] = ((bVar7 != 0) * (uVar13 < 0x100) * bVar7 - (0xff < uVar13)) * '\x02';
        auVar71[7] = ((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6)) * '\x02';
        auVar71[8] = ((bVar3 != 0) * (uVar67 < 0x100) * bVar3 - (0xff < uVar67)) * '\x02';
        auVar71[9] = ((bVar4 != 0) * (uVar68 < 0x100) * bVar4 - (0xff < uVar68)) * '\x02';
        auVar71[10] = ((bVar5 != 0) * (uVar10 < 0x100) * bVar5 - (0xff < uVar10)) * '\x02';
        auVar71[0xb] = ((bVar2 != 0) * (uVar11 < 0x100) * bVar2 - (0xff < uVar11)) * '\x02';
        auVar71[0xc] = ((bVar9 != 0) * (uVar12 < 0x100) * bVar9 - (0xff < uVar12)) * '\x02';
        auVar71[0xd] = ((bVar8 != 0) * (uVar89 < 0x100) * bVar8 - (0xff < uVar89)) * '\x02';
        auVar71[0xe] = ((bVar7 != 0) * (uVar13 < 0x100) * bVar7 - (0xff < uVar13)) * '\x02';
        auVar72 = auVar71 & DAT_0014e990._0_15_ | DAT_0014e6b0._0_15_;
        auVar20[0xd] = 0;
        auVar20._0_13_ = auVar72._0_13_;
        auVar20[0xe] = auVar72[7];
        auVar23[0xc] = auVar72[6];
        auVar23._0_12_ = auVar72._0_12_;
        auVar23._13_2_ = auVar20._13_2_;
        auVar25[0xb] = 0;
        auVar25._0_11_ = auVar72._0_11_;
        auVar25._12_3_ = auVar23._12_3_;
        auVar27[10] = auVar72[5];
        auVar27._0_10_ = auVar72._0_10_;
        auVar27._11_4_ = auVar25._11_4_;
        auVar29[9] = 0;
        auVar29._0_9_ = auVar72._0_9_;
        auVar29._10_5_ = auVar27._10_5_;
        auVar31[8] = auVar72[4];
        auVar31._0_8_ = auVar72._0_8_;
        auVar31._9_6_ = auVar29._9_6_;
        auVar44._7_8_ = 0;
        auVar44._0_7_ = auVar31._8_7_;
        Var37 = CONCAT81(SUB158(auVar44 << 0x40,7),auVar72[3]);
        auVar54._9_6_ = 0;
        auVar54._0_9_ = Var37;
        auVar45._1_10_ = SUB1510(auVar54 << 0x30,5);
        auVar45[0] = auVar72[2];
        auVar55._11_4_ = 0;
        auVar55._0_11_ = auVar45;
        auVar46._1_12_ = SUB1512(auVar55 << 0x20,3);
        auVar46[0] = auVar72[1];
        uVar68 = CONCAT11(0,auVar72[0]);
        auVar34._2_13_ = auVar46;
        auVar34._0_2_ = uVar68;
        auVar21._10_2_ = 0;
        auVar21._0_10_ = auVar34._0_10_;
        auVar21._12_2_ = (short)Var37;
        uVar56 = CONCAT42(auVar21._10_4_,auVar45._0_2_);
        auVar47._6_8_ = 0;
        auVar47._0_6_ = uVar56;
        uVar59 = 0;
        do {
          uVar1 = puVar57[uVar59];
          uVar81 = (undefined1)(uVar1 >> 0x18);
          uVar82 = CONCAT11(uVar81,uVar81);
          uVar81 = (undefined1)(uVar1 >> 0x10);
          uVar33 = CONCAT35(CONCAT21(uVar82,uVar81),CONCAT14(uVar81,uVar1));
          uVar81 = (undefined1)(uVar1 >> 8);
          uVar41 = CONCAT51(CONCAT41((int)((ulong)uVar33 >> 0x20),uVar81),uVar81);
          sVar84 = CONCAT11((char)uVar1,(char)uVar1);
          uVar60 = CONCAT62(uVar41,sVar84);
          auVar79._8_4_ = 0;
          auVar79._0_8_ = uVar60;
          auVar79._12_2_ = uVar82;
          auVar79._14_2_ = uVar82;
          uVar82 = (undefined2)((ulong)uVar33 >> 0x20);
          auVar78._12_4_ = auVar79._12_4_;
          auVar78._8_2_ = 0;
          auVar78._0_8_ = uVar60;
          auVar78._10_2_ = uVar82;
          auVar77._10_6_ = auVar78._10_6_;
          auVar77._8_2_ = uVar82;
          auVar77._0_8_ = uVar60;
          uVar82 = (undefined2)uVar41;
          auVar48._4_8_ = auVar77._8_8_;
          auVar48._2_2_ = uVar82;
          auVar48._0_2_ = uVar82;
          auVar80._0_4_ = ((int)sVar84 >> 8) - (uint)uVar68;
          auVar80._4_4_ =
               (auVar48._0_4_ >> 0x18) - (int)CONCAT82(SUB148(auVar47 << 0x40,6),auVar46._0_2_);
          auVar80._8_4_ = (auVar77._8_4_ >> 0x18) - (int)uVar56;
          auVar80._12_4_ = (auVar78._12_4_ >> 0x18) - (auVar21._10_4_ >> 0x10);
          auVar90 = packssdw(auVar80,auVar80);
          auVar86 = pmulhw(auVar90,auVar90);
          sVar84 = auVar90._6_2_ * auVar90._6_2_;
          iVar61 = CONCAT22(auVar86._6_2_,sVar84);
          Var53 = CONCAT64(CONCAT42(iVar61,auVar86._4_2_),
                           CONCAT22(auVar90._4_2_ * auVar90._4_2_,sVar84));
          auVar49._4_8_ = (long)((unkuint10)Var53 >> 0x10);
          auVar49._2_2_ = auVar86._2_2_;
          auVar49._0_2_ = auVar90._2_2_ * auVar90._2_2_;
          __base[uVar59 * 2] =
               auVar49._0_4_ + iVar61 +
               CONCAT22(auVar86._0_2_,auVar90._0_2_ * auVar90._0_2_) +
               (int)((unkuint10)Var53 >> 0x10);
          __base[uVar59 * 2 + 1] = (int)uVar59;
          uVar59 = uVar59 + 1;
        } while (uVar16 != uVar59);
      }
      qsort(__base,__nmemb,8,iq3_compare_func);
      uVar85 = uVar83 + 1;
      __s[uVar58] = ~uVar83;
      if (grid_size < 1) {
        uVar59 = 0;
        uVar87 = uVar85;
      }
      else {
        iVar61 = *__base;
        uVar87 = grid_size + 1 + uVar83;
        uVar88 = 1;
        uVar60 = 0;
        do {
          if (iVar61 < __base[uVar60 * 2]) {
            if (uVar88 == uVar63) {
              uVar59 = uVar60;
              uVar87 = uVar85 + (int)uVar60;
              break;
            }
            uVar88 = uVar88 + 1;
            iVar61 = __base[uVar60 * 2];
          }
          puVar65[(long)(int)uVar85 + uVar60] = *(uint16_t *)(__base + uVar60 * 2 + 1);
          uVar60 = uVar60 + 1;
          uVar59 = uVar16;
        } while (uVar16 != uVar60);
      }
      puVar65[(int)uVar83] = (uint16_t)uVar59;
      uVar83 = uVar87;
    }
    uVar58 = uVar58 + 1;
    if (uVar58 == 0x1000) {
      free(__base);
      return;
    }
  } while( true );
}

Assistant:

void iq3xs_init_impl(int grid_size) {
    const int gindex = iq3_data_index(grid_size);
    if (iq3_data[gindex].grid) {
        return;
    }
    static const uint16_t kgrid_256[256] = {
            0,     2,     4,     9,    11,    15,    16,    18,    25,    34,    59,    61,    65,    67,    72,    74,
           81,    85,    88,    90,    97,   108,   120,   128,   130,   132,   137,   144,   146,   153,   155,   159,
          169,   175,   189,   193,   199,   200,   202,   213,   248,   267,   287,   292,   303,   315,   317,   321,
          327,   346,   362,   413,   436,   456,   460,   462,   483,   497,   513,   515,   520,   522,   529,   531,
          536,   538,   540,   551,   552,   576,   578,   585,   592,   594,   641,   643,   648,   650,   657,   664,
          698,   704,   706,   720,   729,   742,   758,   769,   773,   808,   848,   852,   870,   889,   901,   978,
          992,  1024,  1026,  1033,  1035,  1040,  1042,  1046,  1049,  1058,  1089,  1091,  1093,  1096,  1098,  1105,
         1112,  1139,  1143,  1144,  1152,  1154,  1161,  1167,  1168,  1170,  1183,  1184,  1197,  1217,  1224,  1228,
         1272,  1276,  1309,  1323,  1347,  1367,  1377,  1404,  1473,  1475,  1486,  1509,  1537,  1544,  1546,  1553,
         1555,  1576,  1589,  1594,  1600,  1602,  1616,  1625,  1636,  1638,  1665,  1667,  1672,  1685,  1706,  1722,
         1737,  1755,  1816,  1831,  1850,  1856,  1862,  1874,  1901,  1932,  1950,  1971,  2011,  2032,  2052,  2063,
         2077,  2079,  2091,  2095,  2172,  2192,  2207,  2208,  2224,  2230,  2247,  2277,  2308,  2345,  2356,  2389,
         2403,  2424,  2501,  2504,  2506,  2520,  2570,  2593,  2616,  2624,  2630,  2646,  2669,  2700,  2714,  2746,
         2754,  2795,  2824,  2835,  2839,  2874,  2882,  2905,  2984,  3028,  3042,  3092,  3108,  3110,  3124,  3153,
         3185,  3215,  3252,  3288,  3294,  3364,  3397,  3434,  3483,  3523,  3537,  3587,  3589,  3591,  3592,  3610,
         3626,  3670,  3680,  3722,  3749,  3754,  3776,  3789,  3803,  3824,  3857,  3873,  3904,  3906,  3924,  3992,
    };
    static const uint16_t kgrid_512[512] = {
            0,     1,     2,     5,     7,     8,     9,    10,    12,    14,    16,    17,    21,    27,    32,    34,
           37,    39,    41,    43,    48,    50,    57,    60,    63,    64,    65,    66,    68,    72,    73,    77,
           80,    83,    87,    89,    93,   100,   113,   117,   122,   128,   129,   133,   135,   136,   139,   142,
          145,   149,   152,   156,   162,   165,   167,   169,   171,   184,   187,   195,   201,   205,   208,   210,
          217,   219,   222,   228,   232,   234,   247,   249,   253,   256,   267,   271,   273,   276,   282,   288,
          291,   297,   312,   322,   324,   336,   338,   342,   347,   353,   357,   359,   374,   379,   390,   393,
          395,   409,   426,   441,   448,   450,   452,   464,   466,   470,   475,   488,   492,   512,   513,   514,
          516,   520,   521,   523,   525,   527,   528,   530,   537,   540,   542,   556,   558,   561,   570,   576,
          577,   579,   582,   584,   588,   593,   600,   603,   609,   616,   618,   632,   638,   640,   650,   653,
          655,   656,   660,   666,   672,   675,   685,   688,   698,   705,   708,   711,   712,   715,   721,   727,
          728,   732,   737,   754,   760,   771,   773,   778,   780,   793,   795,   802,   806,   808,   812,   833,
          840,   843,   849,   856,   858,   873,   912,   916,   919,   932,   934,   961,   963,   968,   970,   977,
          989,   993,  1010,  1016,  1024,  1025,  1027,  1029,  1031,  1032,  1034,  1036,  1038,  1041,  1043,  1047,
         1048,  1050,  1057,  1059,  1061,  1064,  1066,  1079,  1080,  1083,  1085,  1088,  1090,  1096,  1099,  1103,
         1106,  1109,  1113,  1116,  1122,  1129,  1153,  1156,  1159,  1169,  1171,  1176,  1183,  1185,  1195,  1199,
         1209,  1212,  1216,  1218,  1221,  1225,  1234,  1236,  1241,  1243,  1250,  1256,  1270,  1281,  1287,  1296,
         1299,  1306,  1309,  1313,  1338,  1341,  1348,  1353,  1362,  1375,  1376,  1387,  1400,  1408,  1410,  1415,
         1425,  1453,  1457,  1477,  1481,  1494,  1496,  1507,  1512,  1538,  1545,  1547,  1549,  1551,  1554,  1561,
         1563,  1565,  1570,  1572,  1575,  1577,  1587,  1593,  1601,  1603,  1605,  1612,  1617,  1619,  1632,  1648,
         1658,  1662,  1664,  1674,  1680,  1690,  1692,  1704,  1729,  1736,  1740,  1745,  1747,  1751,  1752,  1761,
         1763,  1767,  1773,  1787,  1795,  1801,  1806,  1810,  1817,  1834,  1840,  1844,  1857,  1864,  1866,  1877,
         1882,  1892,  1902,  1915,  1934,  1953,  1985,  1987,  2000,  2002,  2013,  2048,  2052,  2058,  2064,  2068,
         2071,  2074,  2081,  2088,  2104,  2114,  2119,  2121,  2123,  2130,  2136,  2141,  2147,  2153,  2157,  2177,
         2179,  2184,  2189,  2193,  2203,  2208,  2223,  2226,  2232,  2244,  2249,  2251,  2256,  2258,  2265,  2269,
         2304,  2306,  2324,  2335,  2336,  2361,  2373,  2375,  2385,  2418,  2443,  2460,  2480,  2504,  2509,  2520,
         2531,  2537,  2562,  2568,  2572,  2578,  2592,  2596,  2599,  2602,  2614,  2620,  2625,  2627,  2629,  2634,
         2641,  2650,  2682,  2688,  2697,  2707,  2712,  2718,  2731,  2754,  2759,  2760,  2775,  2788,  2793,  2805,
         2811,  2817,  2820,  2832,  2842,  2854,  2890,  2902,  2921,  2923,  2978,  3010,  3012,  3026,  3081,  3083,
         3085,  3097,  3099,  3120,  3136,  3152,  3159,  3188,  3210,  3228,  3234,  3245,  3250,  3256,  3264,  3276,
         3281,  3296,  3349,  3363,  3378,  3392,  3395,  3420,  3440,  3461,  3488,  3529,  3531,  3584,  3588,  3591,
         3600,  3602,  3614,  3616,  3628,  3634,  3650,  3657,  3668,  3683,  3685,  3713,  3716,  3720,  3726,  3729,
         3736,  3753,  3778,  3802,  3805,  3819,  3841,  3845,  3851,  3856,  3880,  3922,  3938,  3970,  3993,  4032,
    };

    const int kmap_size = 4096;
    const int nwant = grid_size == 256 ? 2 : 3;
    const uint16_t * kgrid = grid_size == 256 ? kgrid_256 : kgrid_512;
    uint32_t * kgrid_q3xs;
    int      * kmap_q3xs;
    uint16_t * kneighbors_q3xs;

    //printf("================================================================= %s(grid_size = %d)\n", __func__, grid_size);
    uint32_t * the_grid = (uint32_t *)malloc(grid_size*sizeof(uint32_t));
    for (int k = 0; k < grid_size; ++k) {
        int8_t * pos = (int8_t *)(the_grid + k);
        for (int i = 0; i < 4; ++i) {
            int l = (kgrid[k] >> 3*i) & 0x7;
            pos[i] = 2*l + 1;
        }
    }
    kgrid_q3xs = the_grid;
    iq3_data[gindex].grid = the_grid;
    kmap_q3xs = (int *)malloc(kmap_size*sizeof(int));
    iq3_data[gindex].map = kmap_q3xs;
    for (int i = 0; i < kmap_size; ++i) kmap_q3xs[i] = -1;
    uint32_t aux32;
    uint8_t * aux8 = (uint8_t *)&aux32;
    for (int i = 0; i < grid_size; ++i) {
        aux32 = kgrid_q3xs[i];
        uint16_t index = 0;
        for (int k=0; k<4; ++k) {
            uint16_t q = (aux8[k] - 1)/2;
            index |= (q << 3*k);
        }
        kmap_q3xs[index] = i;
    }
    int8_t pos[4];
    int * dist2 = (int *)malloc(2*grid_size*sizeof(int));
    int num_neighbors = 0, num_not_in_map = 0;
    for (int i = 0; i < kmap_size; ++i) {
        if (kmap_q3xs[i] >= 0) continue;
        ++num_not_in_map;
        for (int k = 0; k < 4; ++k) {
            int l = (i >> 3*k) & 0x7;
            pos[k] = 2*l + 1;
        }
        for (int j = 0; j < grid_size; ++j) {
            const int8_t * pg = (const int8_t *)(kgrid_q3xs + j);
            int d2 = 0;
            for (int k = 0; k < 4; ++k) d2 += (pg[k] - pos[k])*(pg[k] - pos[k]);
            dist2[2*j+0] = d2;
            dist2[2*j+1] = j;
        }
        qsort(dist2, grid_size, 2*sizeof(int), iq3_compare_func);
        int n = 0; int d2 = dist2[0];
        int nhave = 1;
        for (int j = 0; j < grid_size; ++j) {
            if (dist2[2*j] > d2) {
                if (nhave == nwant) break;
                d2 = dist2[2*j];
                ++nhave;
            }
            ++n;
        }
        num_neighbors += n;
    }
    //printf("%s: %d neighbours in total\n", __func__, num_neighbors);
    kneighbors_q3xs = (uint16_t *)malloc((num_neighbors + num_not_in_map)*sizeof(uint16_t));
    iq3_data[gindex].neighbours = kneighbors_q3xs;
    int counter = 0;
    for (int i = 0; i < kmap_size; ++i) {
        if (kmap_q3xs[i] >= 0) continue;
        for (int k = 0; k < 4; ++k) {
            int l = (i >> 3*k) & 0x7;
            pos[k] = 2*l + 1;
        }
        for (int j = 0; j < grid_size; ++j) {
            const int8_t * pg = (const int8_t *)(kgrid_q3xs + j);
            int d2 = 0;
            for (int k = 0; k < 4; ++k) d2 += (pg[k] - pos[k])*(pg[k] - pos[k]);
            dist2[2*j+0] = d2;
            dist2[2*j+1] = j;
        }
        qsort(dist2, grid_size, 2*sizeof(int), iq3_compare_func);
        kmap_q3xs[i] = -(counter + 1);
        int d2 = dist2[0];
        uint16_t * start = &kneighbors_q3xs[counter++];
        int n = 0, nhave = 1;
        for (int j = 0; j < grid_size; ++j) {
            if (dist2[2*j] > d2) {
                if (nhave == nwant) break;
                d2 = dist2[2*j];
                ++nhave;
            }
            kneighbors_q3xs[counter++] = dist2[2*j+1];
            ++n;
        }
        *start = n;
    }
    free(dist2);
}